

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

void __thiscall DiskTable::DiskTable(DiskTable *this,path *db_dir)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  reference pdVar5;
  path *ppVar6;
  value_type *__x;
  directory_entry *node_path;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  *__range2_1;
  directory_entry *sstable_file;
  undefined1 local_4c0 [8];
  directory_iterator __end2;
  undefined1 local_4a0 [8];
  directory_iterator __begin2;
  directory_iterator *__range2;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  node_path_buf;
  undefined1 auStack_458 [8];
  DiskViewLevel new_view_level;
  directory_entry *level;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  *__range1_1;
  path local_400;
  path local_3d8;
  path local_3b0;
  path local_388;
  value_type *local_360;
  directory_entry *d;
  undefined1 local_348 [8];
  directory_iterator __end1;
  undefined1 local_328 [8];
  directory_iterator __begin1;
  directory_iterator *__range1;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  dir_buf;
  directory_iterator dir;
  path local_2d0;
  path local_2a8;
  undefined1 local_280 [8];
  ifstream clock_is;
  path local_78;
  path local_50;
  path *local_18;
  path *db_dir_local;
  DiskTable *this_local;
  
  local_18 = db_dir;
  db_dir_local = (path *)this;
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::vector(&this->diskView);
  std::filesystem::__cxx11::path::path(&this->db_home);
  this->LEVEL0_LIMIT = 2;
  this->LEVEL_FACTOR = 2;
  this->SSTABLE_SIZE_LIMIT = 2000000;
  std::filesystem::__cxx11::path::operator=(&this->db_home,local_18);
  bVar2 = std::filesystem::exists(local_18);
  if (!bVar2) {
    std::filesystem::create_directory(local_18);
  }
  ppVar6 = local_18;
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_78,(char (*) [13])"sstable.lock",auto_format);
  std::filesystem::__cxx11::operator/(&local_50,ppVar6,&local_78);
  bVar2 = std::filesystem::exists(&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  std::filesystem::__cxx11::path::~path(&local_78);
  ppVar6 = local_18;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
              (&local_2d0,(char (*) [13])"sstable.lock",auto_format);
    std::filesystem::__cxx11::operator/(&local_2a8,ppVar6,&local_2d0);
    create_binary_ifstream((path *)local_280);
    std::filesystem::__cxx11::path::~path(&local_2a8);
    std::filesystem::__cxx11::path::~path(&local_2d0);
    bytes_read<unsigned_long>((istream *)local_280,&this->SSTableClock,0);
    std::ifstream::~ifstream(local_280);
  }
  else {
    this->SSTableClock = 0;
  }
  dir._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = &dir._M_dir._M_refcount;
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::vector((vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
            *)p_Var1);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::operator=(&this->diskView,
              (vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
               *)p_Var1);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::~vector((vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             *)p_Var1);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::reserve(&this->diskView,0x40);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)
             &dir_buf.
              super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18);
  memset(&__range1,0,0x18);
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
            *)&__range1);
  __begin1._M_dir._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &dir_buf.
        super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,
             (directory_iterator *)__begin1._M_dir._M_refcount._M_pi);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_328,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&d,(directory_iterator *)__begin1._M_dir._M_refcount._M_pi);
  std::filesystem::__cxx11::end((directory_iterator *)local_348);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&d);
  while (bVar2 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_328,(directory_iterator *)local_348), bVar2)
  {
    local_360 = (value_type *)
                std::filesystem::__cxx11::directory_iterator::operator*
                          ((directory_iterator *)local_328);
    bVar2 = std::filesystem::__cxx11::directory_entry::is_directory(local_360);
    if (bVar2) {
      std::
      vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ::push_back((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&__range1,local_360);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_328);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_348)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_328)
  ;
  bVar2 = std::
          vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
          ::empty((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&__range1);
  ppVar6 = local_18;
  if (bVar2) {
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (&local_3b0,(char (*) [2])"0",auto_format);
    std::filesystem::__cxx11::operator/(&local_388,ppVar6,&local_3b0);
    std::filesystem::create_directory(&local_388);
    std::filesystem::__cxx11::path::~path(&local_388);
    std::filesystem::__cxx11::path::~path(&local_3b0);
    ppVar6 = local_18;
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (&local_400,(char (*) [2])"0",auto_format);
    std::filesystem::__cxx11::operator/(&local_3d8,ppVar6,&local_400);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::emplace_back<std::filesystem::__cxx11::path>
              ((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                *)&__range1,&local_3d8);
    std::filesystem::__cxx11::path::~path(&local_3d8);
    std::filesystem::__cxx11::path::~path(&local_400);
  }
  iVar3 = std::
          vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
          ::begin((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&__range1);
  iVar4 = std::
          vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
          ::end((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                 *)&__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>
            (iVar3._M_current,iVar4._M_current);
  __end1_1 = std::
             vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ::begin((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                      *)&__range1);
  level = (directory_entry *)
          std::
          vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
          ::end((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                 *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
                             *)&level), bVar2) {
    pdVar5 = __gnu_cxx::
             __normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
             ::operator*(&__end1_1);
    auStack_458 = (undefined1  [8])0x0;
    new_view_level.super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    new_view_level.super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)0x0;
    std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::list
              ((list<DiskTableNode,_std::allocator<DiskTableNode>_> *)auStack_458);
    __range2 = (directory_iterator *)0x0;
    node_path_buf.
    super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    node_path_buf.
    super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
              *)&__range2);
    ppVar6 = std::filesystem::__cxx11::directory_entry::path(pdVar5);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)&__begin2._M_dir._M_refcount,ppVar6);
    p_Var1 = &__begin2._M_dir._M_refcount;
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)&__end2._M_dir._M_refcount,(directory_iterator *)p_Var1);
    std::filesystem::__cxx11::begin
              ((__cxx11 *)local_4a0,(directory_iterator *)&__end2._M_dir._M_refcount);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)&__end2._M_dir._M_refcount);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)&sstable_file,(directory_iterator *)p_Var1);
    std::filesystem::__cxx11::end((directory_iterator *)local_4c0);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)&sstable_file);
    while (bVar2 = std::filesystem::__cxx11::operator!=
                             ((directory_iterator *)local_4a0,(directory_iterator *)local_4c0),
          bVar2) {
      __x = (value_type *)
            std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)local_4a0)
      ;
      std::
      vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ::push_back((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&__range2,__x);
      std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_4a0);
    }
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)local_4c0);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)local_4a0);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)&__begin2._M_dir._M_refcount);
    iVar3 = std::
            vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
            ::begin((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                     *)&__range2);
    iVar4 = std::
            vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
            ::end((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&__range2);
    std::
    sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>
              (iVar3._M_current,iVar4._M_current);
    __end2_1 = std::
               vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
               ::begin((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                        *)&__range2);
    node_path = (directory_entry *)
                std::
                vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                ::end((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                       *)&__range2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
                               *)&node_path), bVar2) {
      pdVar5 = __gnu_cxx::
               __normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
               ::operator*(&__end2_1);
      std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>::
      emplace_back<std::filesystem::__cxx11::directory_entry_const&>
                ((list<DiskTableNode,std::allocator<DiskTableNode>> *)auStack_458,pdVar5);
      __gnu_cxx::
      __normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
    ::push_back(&this->diskView,(value_type *)auStack_458);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::~vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
               *)&__range2);
    std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::~list
              ((list<DiskTableNode,_std::allocator<DiskTableNode>_> *)auStack_458);
    __gnu_cxx::
    __normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::~vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             *)&__range1);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)
             &dir_buf.
              super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

DiskTable::DiskTable(path &db_dir) {
    /*
     * Scan db_dir, build diskView.
     * Structure of db_dir like this:
         db_dir
              | <dir> 0
              | <dir> 1
              | <dir> ...
              | sstable.lock // store SSTableClock, for simplifying naming of SSTable.
     * Every sub dir corresponding to a level according to its name(level number)
     * In every sub dir, there are some SSTable, whose filename is just SSTableClock when it was written to disk,
     * such naming is for convenience of relocating SSTable in a level when compaction.
    */
    static auto compare_dir_entry_by_numeric_asc = [](directory_entry &candidate, directory_entry &current) {
        if (current.is_directory()) {
            auto candidate_dir_name = --(candidate.path().end());
            auto current_dir_name = --(current.path().end());
            while (*candidate_dir_name == "") {
                candidate_dir_name--;
            }
            while (*current_dir_name == "") {
                current_dir_name--;
            }
            return atoll(candidate_dir_name->c_str()) < atoll(current_dir_name->c_str());
        } else {
            return atoll(candidate.path().filename().c_str()) < atoll(current.path().filename().c_str());
        }
    };
    db_home = db_dir;
    if (!exists(db_dir)) {
        create_directory(db_dir);
    }
    if (!exists(db_dir / "sstable.lock")) {
        SSTableClock = 0;
    } else {
        auto clock_is = create_binary_ifstream(db_dir / "sstable.lock");
        bytes_read(clock_is, &SSTableClock);
    }

    diskView = DiskView{};
    diskView.reserve(64);
    auto dir = directory_iterator{db_dir};
    auto dir_buf = std::vector<directory_entry>{}; // directory_iterator is out-of-order, use a buf to sort them.
    for (const auto &d:dir) {
        if (d.is_directory()) {
            // Skip other files in db_dir.
            dir_buf.push_back(d);
        }
    }
    if (dir_buf.empty()) {
        create_directory(db_dir / "0");
        dir_buf.emplace_back(db_dir / "0");
    }
    std::sort(dir_buf.begin(), dir_buf.end(), compare_dir_entry_by_numeric_asc);
    for (const auto &level:dir_buf) {
        auto new_view_level = DiskViewLevel{};
        auto node_path_buf = std::vector<directory_entry>{};
        for (const auto &sstable_file:directory_iterator{level.path()}) {
            node_path_buf.push_back(sstable_file);
        }
        // To ensure correctness, we must enforce that sstable written later in level 0 placed into diskView[0][1](if exists)
        std::sort(node_path_buf.begin(), node_path_buf.end(), compare_dir_entry_by_numeric_asc);
        for (const auto &node_path:node_path_buf) {
            new_view_level.emplace_back(node_path);
        }
        diskView.push_back(std::move(new_view_level));
    }
}